

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

tEdge __thiscall MeshLib::Solid::idEdge(Solid *this,int id0,int id1)

{
  Edge *pEVar1;
  undefined1 local_78 [8];
  Edge e;
  int id1_local;
  int id0_local;
  Solid *this_local;
  
  e.m_kuv._0_4_ = id1;
  e.m_kuv._4_4_ = id0;
  Edge::Edge((Edge *)local_78,id0,id1);
  pEVar1 = AVL::Tree<MeshLib::Edge>::find(&this->m_edges,(Edge *)local_78);
  Edge::~Edge((Edge *)local_78);
  return pEVar1;
}

Assistant:

Solid::tEdge Solid::idEdge( int id0, int id1 )
{
	Edge e(id0,id1);
	return  m_edges.find( &e );//insert a new vertex, with id as the key
}